

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlTextReaderPtr xmlNewTextReaderFilename(char *URI)

{
  xmlParserInputBufferPtr input;
  xmlTextReaderPtr pxVar1;
  
  pxVar1 = (xmlTextReaderPtr)0x0;
  input = xmlParserInputBufferCreateFilename(URI,XML_CHAR_ENCODING_NONE);
  if (input != (xmlParserInputBufferPtr)0x0) {
    pxVar1 = xmlNewTextReader(input,URI);
    if (pxVar1 == (xmlTextReaderPtr)0x0) {
      xmlFreeParserInputBuffer(input);
      pxVar1 = (xmlTextReaderPtr)0x0;
    }
    else {
      *(byte *)&pxVar1->allocs = (byte)pxVar1->allocs | 1;
    }
  }
  return pxVar1;
}

Assistant:

xmlTextReaderPtr
xmlNewTextReaderFilename(const char *URI) {
    xmlParserInputBufferPtr input;
    xmlTextReaderPtr ret;

    input = xmlParserInputBufferCreateFilename(URI, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
	return(NULL);
    ret = xmlNewTextReader(input, URI);
    if (ret == NULL) {
	xmlFreeParserInputBuffer(input);
	return(NULL);
    }
    ret->allocs |= XML_TEXTREADER_INPUT;
    return(ret);
}